

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O1

bool __thiscall
ON_ModelComponent::ChangeName
          (ON_ModelComponent *this,wchar_t *new_name,ON_ComponentManifest *manifest)

{
  bool bVar1;
  ON_ComponentManifestItem *pOVar2;
  wchar_t *name;
  ON_UUID *pOVar3;
  char *sFormat;
  byte bVar4;
  uint uVar5;
  int line_number;
  undefined8 unaff_R12;
  undefined8 uVar6;
  uint uVar7;
  ON_wString local_name;
  ON_UUID name_parent_id;
  ON_NameHash new_name_hash;
  ON_wString local_78;
  undefined8 local_70;
  ON_UUID local_68;
  ON_NameHash local_58;
  
  uVar6 = CONCAT71((int7)((ulong)unaff_R12 >> 8),this->m_component_type);
  if (manifest != (ON_ComponentManifest *)0x0) {
    pOVar2 = ON_ComponentManifest::ItemFromId(manifest,this->m_component_type,this->m_component_id);
    bVar1 = ON_ComponentManifestItem::IsUnset(pOVar2);
    if (bVar1) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x540,"","component is not in the manifest.");
      return false;
    }
  }
  uVar5 = (int)uVar6 - 1;
  bVar4 = (byte)uVar5;
  local_70 = uVar6;
  if ((bVar4 < 0x11) && ((0x17fffU >> (uVar5 & 0x1f) & 1) != 0)) {
    uVar7 = 0x1c6f8 >> (bVar4 & 0x1f);
  }
  else {
    uVar7 = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x807,"","Invalid component_type parameter.");
  }
  ON_wString::ON_wString(&local_78,new_name);
  ON_wString::TrimLeftAndRight(&local_78,(wchar_t *)0x0);
  name = ON_wString::operator_cast_to_wchar_t_(&local_78);
  if ((bVar4 < 0x11) && ((0x17fffU >> (uVar5 & 0x1f) & 1) != 0)) {
    uVar5 = 0x8010 >> (bVar4 & 0x1f);
  }
  else {
    uVar5 = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x7e5,"","Invalid component_type parameter.");
  }
  uVar6 = local_70;
  if ((uVar5 & 1) == 0) {
    pOVar3 = &ON_nil_uuid;
  }
  else {
    pOVar3 = &this->m_component_parent_id;
  }
  local_68.Data1 = pOVar3->Data1;
  local_68.Data2 = pOVar3->Data2;
  local_68.Data3 = pOVar3->Data3;
  local_68.Data4 = *&pOVar3->Data4;
  ON_NameHash::Create(&local_58,&local_68,name);
  bVar1 = ON_wString::IsEmpty(&local_78);
  if (bVar1) {
    if ((uVar7 & 1) == 0) {
LAB_0053b165:
      if (manifest != (ON_ComponentManifest *)0x0) {
        pOVar2 = ON_ComponentManifest::ChangeComponentName
                           (manifest,this->m_component_id,(Type)uVar6,this->m_component_parent_id,
                            name);
        bVar1 = ON_ComponentManifestItem::IsUnset(pOVar2);
        if (bVar1) {
          sFormat = "Unable to update manifest.";
          line_number = 0x569;
          goto LAB_0053b1a2;
        }
      }
      bVar1 = ON_wString::IsEmpty(&local_78);
      if (bVar1) {
        uVar5 = ClearModelComponentAttributes(this,0xa0);
        bVar1 = uVar5 == 0xa0;
      }
      else {
        bVar1 = SetName(this,name);
      }
      if (bVar1 == false) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                   ,0x574,"","Unable to change component name.");
      }
      goto LAB_0053b1b9;
    }
    sFormat = "This component cannot have an empty name.";
    line_number = 0x552;
  }
  else {
    bVar1 = IsValidComponentName(name);
    if (!bVar1) {
      if ((~(byte)uVar7 & 1) == 0 && manifest != (ON_ComponentManifest *)0x0) {
        pOVar2 = ON_ComponentManifest::ItemFromNameHash(manifest,(Type)uVar6,&local_58);
        bVar1 = ON_ComponentManifestItem::IsValid(pOVar2);
        if (bVar1) {
          bVar1 = false;
          goto LAB_0053b1b9;
        }
      }
      goto LAB_0053b165;
    }
    sFormat = "Invalid component name.";
    line_number = 0x558;
  }
LAB_0053b1a2:
  bVar1 = false;
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
             ,line_number,"",sFormat);
LAB_0053b1b9:
  ON_wString::~ON_wString(&local_78);
  return bVar1;
}

Assistant:

bool ON_ModelComponent::ChangeName(
  const wchar_t* new_name,
  class ON_ComponentManifest* manifest
)
{
  const ON_ModelComponent::Type component_type = ComponentType();

  if (nullptr != manifest)
  {
    if (manifest->ItemFromId(component_type, Id()).IsUnset())
    {
      ON_ERROR("component is not in the manifest.");
      return false;
    }
  }

  const bool bUniqueNameRequired = ON_ModelComponent::UniqueNameRequired(component_type);
  ON_wString local_name(new_name);
  local_name.TrimLeftAndRight();
  new_name = local_name;
  const ON_UUID name_parent_id
    = ON_ModelComponent::UniqueNameIncludesParent(component_type)
    ? ParentId()
    : ON_nil_uuid;
  const ON_NameHash new_name_hash = ON_NameHash::Create(name_parent_id,new_name);
  if (local_name.IsEmpty() )
  {
    if (bUniqueNameRequired)
    {
      ON_ERROR("This component cannot have an empty name.");
      return false;
    }
  }
  else if (ON_ModelComponent::IsValidComponentName(new_name))
  {
    ON_ERROR("Invalid component name.");
    return false;
  }
  else if (bUniqueNameRequired && nullptr != manifest )
  {
    if (manifest->ItemFromNameHash(component_type, new_name_hash).IsValid())
    {
      // name is already being used.
      return false;
    }
  }

  if ( 
    nullptr != manifest
    && manifest->ChangeComponentName(Id(), component_type, ParentId(), new_name).IsUnset() 
    )
  {
    ON_ERROR("Unable to update manifest.");
    return false;
  }

  const bool rc
    = (local_name.IsEmpty())
    ? ClearName()
    : SetName(new_name);

  if (false == rc)
  {
    ON_ERROR("Unable to change component name.");
    return false;
  }

  return true;
}